

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

void __thiscall TCLAP::ArgException::~ArgException(ArgException *this)

{
  ArgException *this_local;
  
  ~ArgException(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ArgException() throw() { }